

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiSwapchainTests.cpp
# Opt level: O2

TestStatus *
vkt::wsi::anon_unknown_0::basicRenderTest
          (TestStatus *__return_storage_ptr__,Context *context,Type wsiType)

{
  InstanceDriver *vki;
  DeviceDriver *vk;
  void **this;
  BinaryCollection *binaryRegistry;
  VkDevice_s *device;
  VkResult VVar1;
  TestError *this_00;
  ulong numFences;
  ulong uVar2;
  size_t numCommandBuffers;
  deUint32 dVar3;
  deUint32 imageNdx;
  VkFence imageReadyFence;
  VkPipelineStageFlags waitDstStage;
  VkSemaphore imageReadySemaphore;
  vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  swapchainImages;
  VkCommandBuffer commandBuffer;
  VkSemaphore renderingCompleteSemaphore;
  UVec2 desiredSize;
  RefBase<vk::Handle<(vk::HandleType)26>_> local_d98;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
  commandBuffers;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  renderingCompleteSemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
  imageReadySemaphores;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
  imageReadyFences;
  RefBase<vk::Handle<(vk::HandleType)25>_> local_d18;
  _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  local_cf0;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_cd8;
  VkPresentInfoKHR presentInfo;
  NativeObjects native;
  VkSubmitInfo submitInfo;
  VkSwapchainCreateInfoKHR swapchainInfo;
  TriangleRenderer renderer;
  DeviceHelper devHelper;
  InstanceHelper instHelper;
  SimpleAllocator allocator;
  
  desiredSize.m_data[0] = 0x100;
  desiredSize.m_data[1] = 0x100;
  InstanceHelper::InstanceHelper(&instHelper,context,wsiType,(VkAllocationCallbacks *)0x0);
  tcu::Maybe<tcu::Vector<unsigned_int,_2>_>::Maybe
            ((Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper,&desiredSize);
  NativeObjects::NativeObjects
            (&native,context,&instHelper.supportedExtensions,wsiType,
             (Maybe<tcu::Vector<unsigned_int,_2>_> *)&devHelper);
  vki = &instHelper.vki;
  dVar3 = 0;
  ::vk::wsi::createSurface
            ((Move<vk::Handle<(vk::HandleType)25>_> *)&devHelper,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,wsiType,
             native.display.
             super_UniqueBase<vk::wsi::Display,_de::DefaultDeleter<vk::wsi::Display>_>.m_data.ptr,
             native.window.super_UniqueBase<vk::wsi::Window,_de::DefaultDeleter<vk::wsi::Window>_>.
             m_data.ptr,(VkAllocationCallbacks *)0x0);
  local_d18.m_data.deleter.m_instance =
       (VkInstance)devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  local_d18.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice;
  local_d18.m_data.object.m_internal = (deUint64)devHelper.physicalDevice;
  local_d18.m_data.deleter.m_instanceIface = (InstanceInterface *)devHelper._8_8_;
  devHelper.physicalDevice = (VkPhysicalDevice)0x0;
  devHelper.queueFamilyIndex = 0;
  devHelper._12_4_ = 0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)25>_> *)&devHelper);
  DeviceHelper::DeviceHelper
            (&devHelper,context,&vki->super_InstanceInterface,
             instHelper.instance.super_RefBase<vk::VkInstance_s_*>.m_data.object,
             (VkSurfaceKHR)local_d18.m_data.object.m_internal,(VkAllocationCallbacks *)0x0);
  device = devHelper.device.super_RefBase<vk::VkDevice_s_*>.m_data.object;
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&submitInfo,&vki->super_InstanceInterface,
             devHelper.physicalDevice);
  vk = &devHelper.vkd;
  ::vk::SimpleAllocator::SimpleAllocator
            (&allocator,&vk->super_DeviceInterface,device,
             (VkPhysicalDeviceMemoryProperties *)&submitInfo);
  getBasicSwapchainParameters
            (&swapchainInfo,wsiType,&vki->super_InstanceInterface,devHelper.physicalDevice,
             (VkSurfaceKHR)local_d18.m_data.object.m_internal,&desiredSize,dVar3);
  ::vk::createSwapchainKHR
            ((Move<vk::Handle<(vk::HandleType)26>_> *)&submitInfo,&vk->super_DeviceInterface,device,
             &swapchainInfo,(VkAllocationCallbacks *)0x0);
  local_d98.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_d98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_d98.m_data.object.m_internal = submitInfo._0_8_;
  local_d98.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)26>_> *)&submitInfo);
  ::vk::wsi::getSwapchainImages
            (&swapchainImages,&vk->super_DeviceInterface,device,
             (VkSwapchainKHR)local_d98.m_data.object.m_internal);
  binaryRegistry = context->m_progCollection;
  std::vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
  vector((vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_> *)
         &local_cf0,&swapchainImages);
  submitInfo.sType = swapchainInfo.imageExtent.width;
  submitInfo._4_4_ = swapchainInfo.imageExtent.height;
  TriangleRenderer::TriangleRenderer
            (&renderer,&vk->super_DeviceInterface,device,&allocator.super_Allocator,binaryRegistry,
             (vector<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
              *)&local_cf0,swapchainInfo.imageFormat,(UVec2 *)&submitInfo);
  std::_Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
  ::~_Vector_base(&local_cf0);
  numCommandBuffers = 0;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&submitInfo,&vk->super_DeviceInterface,device,
             2,devHelper.queueFamilyIndex,(VkAllocationCallbacks *)0x0);
  local_cd8.m_data.deleter.m_device = (VkDevice)submitInfo._16_8_;
  local_cd8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)submitInfo.pWaitSemaphores;
  local_cd8.m_data.object.m_internal = submitInfo._0_8_;
  local_cd8.m_data.deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&submitInfo);
  numFences = (long)swapchainImages.
                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)swapchainImages.
                    super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2;
  createFences(&imageReadyFences,&vk->super_DeviceInterface,device,numFences);
  createSemaphores(&imageReadySemaphores,&vk->super_DeviceInterface,device,numFences | 1);
  createSemaphores(&renderingCompleteSemaphores,&vk->super_DeviceInterface,device,numFences);
  allocateCommandBuffers
            (&commandBuffers,&vk->super_DeviceInterface,device,
             (VkCommandPool)local_cd8.m_data.object.m_internal,(VkCommandBufferLevel)numFences,
             numCommandBuffers);
  this = &submitInfo.pNext;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 600) {
      VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[4])(vk,device);
      ::vk::checkResult(VVar1,"vkd.deviceWaitIdle(device)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x599);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&submitInfo,"Rendering tests succeeded",(allocator<char> *)&presentInfo);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)&submitInfo);
      std::__cxx11::string::~string((string *)&submitInfo);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
      ::~vector(&commandBuffers);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&renderingCompleteSemaphores);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
      ::~vector(&imageReadySemaphores);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
      ::~vector(&imageReadyFences);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_cd8);
      TriangleRenderer::~TriangleRenderer(&renderer);
      std::
      _Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>::
      ~_Vector_base(&swapchainImages.
                     super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                   );
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)26>_>::~RefBase(&local_d98);
      DeviceHelper::~DeviceHelper(&devHelper);
      ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)25>_>::~RefBase(&local_d18);
      NativeObjects::~NativeObjects(&native);
      InstanceHelper::~InstanceHelper(&instHelper);
      return __return_storage_ptr__;
    }
    imageReadyFence.m_internal =
         ((imageReadyFences.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar2 % (ulong)((long)imageReadyFences.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)imageReadyFences.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)6>_>).m_data.object.m_internal;
    imageReadySemaphore.m_internal =
         ((imageReadySemaphores.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar2 % (ulong)((long)imageReadySemaphores.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)imageReadySemaphores.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    imageNdx = 0xffffffff;
    dVar3 = 1;
    if (numFences <= uVar2) {
      VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x16])
                        (vk,device,1,&imageReadyFence,1,0xffffffffffffffff);
      ::vk::checkResult(VVar1,
                        "vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x563);
    }
    VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x14])
                      (vk,device,1,&imageReadyFence);
    ::vk::checkResult(VVar1,"vkd.resetFences(device, 1, &imageReadyFence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x565);
    VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x7b])
                      (vk,device,local_d98.m_data.object.m_internal,0xffffffffffffffff,
                       imageReadySemaphore.m_internal,imageReadyFence.m_internal,&imageNdx);
    if (VVar1 == VK_SUBOPTIMAL_KHR) {
      submitInfo._0_8_ = context->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"Got ");
      ::vk::operator<<((ostream *)this,VK_SUBOPTIMAL_KHR);
      std::operator<<((ostream *)this," at frame ");
      std::ostream::_M_insert<unsigned_long>((ulong)this);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&submitInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this);
    }
    else {
      ::vk::checkResult(VVar1,"acquireResult",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                        ,0x572);
    }
    if ((ulong)((long)swapchainImages.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)swapchainImages.
                      super__Vector_base<vk::Handle<(vk::HandleType)9>,_std::allocator<vk::Handle<(vk::HandleType)9>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= (ulong)imageNdx) break;
    renderingCompleteSemaphore.m_internal =
         ((renderingCompleteSemaphores.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar2 % (ulong)((long)renderingCompleteSemaphores.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)renderingCompleteSemaphores.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::Handle<(vk::HandleType)4>_>).m_data.object.m_internal;
    commandBuffer =
         ((commandBuffers.
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [uVar2 % (ulong)((long)commandBuffers.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)commandBuffers.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkCommandBuffer_s_*>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4)].m_ptr)->
         super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
    submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    submitInfo.pNext = (void *)0x0;
    waitDstStage = 0x400;
    submitInfo.waitSemaphoreCount = 1;
    submitInfo.pWaitSemaphores = &imageReadySemaphore;
    submitInfo.pWaitDstStageMask = &waitDstStage;
    submitInfo.pCommandBuffers = &commandBuffer;
    presentInfo.pWaitSemaphores = &renderingCompleteSemaphore;
    presentInfo.sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
    presentInfo.pNext = (void *)0x0;
    presentInfo.pSwapchains = (VkSwapchainKHR *)&local_d98;
    presentInfo.pImageIndices = &imageNdx;
    presentInfo.pResults = (VkResult *)0x0;
    presentInfo.waitSemaphoreCount = dVar3;
    presentInfo.swapchainCount = dVar3;
    submitInfo.commandBufferCount = dVar3;
    submitInfo.signalSemaphoreCount = dVar3;
    submitInfo.pSignalSemaphores = presentInfo.pWaitSemaphores;
    TriangleRenderer::recordFrame(&renderer,commandBuffer,imageNdx,(deUint32)uVar2);
    VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[2])
                      (vk,devHelper.queue,1,&submitInfo,0);
    ::vk::checkResult(VVar1,"vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x594);
    VVar1 = (*devHelper.vkd.super_DeviceInterface._vptr_DeviceInterface[0x7c])
                      (vk,devHelper.queue,&presentInfo);
    ::vk::checkResult(VVar1,"vkd.queuePresentKHR(devHelper.queue, &presentInfo)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
                      ,0x595);
    uVar2 = uVar2 + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"(size_t)imageNdx < swapchainImages.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/wsi/vktWsiSwapchainTests.cpp"
             ,0x575);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestStatus basicRenderTest (Context& context, Type wsiType)
{
	const tcu::UVec2				desiredSize					(256, 256);
	const InstanceHelper			instHelper					(context, wsiType);
	const NativeObjects				native						(context, instHelper.supportedExtensions, wsiType, tcu::just(desiredSize));
	const Unique<VkSurfaceKHR>		surface						(createSurface(instHelper.vki, *instHelper.instance, wsiType, *native.display, *native.window));
	const DeviceHelper				devHelper					(context, instHelper.vki, *instHelper.instance, *surface);
	const DeviceInterface&			vkd							= devHelper.vkd;
	const VkDevice					device						= *devHelper.device;
	SimpleAllocator					allocator					(vkd, device, getPhysicalDeviceMemoryProperties(instHelper.vki, devHelper.physicalDevice));
	const VkSwapchainCreateInfoKHR	swapchainInfo				= getBasicSwapchainParameters(wsiType, instHelper.vki, devHelper.physicalDevice, *surface, desiredSize, 2);
	const Unique<VkSwapchainKHR>	swapchain					(createSwapchainKHR(vkd, device, &swapchainInfo));
	const vector<VkImage>			swapchainImages				= getSwapchainImages(vkd, device, *swapchain);

	const TriangleRenderer			renderer					(vkd,
																 device,
																 allocator,
																 context.getBinaryCollection(),
																 swapchainImages,
																 swapchainInfo.imageFormat,
																 tcu::UVec2(swapchainInfo.imageExtent.width, swapchainInfo.imageExtent.height));

	const Unique<VkCommandPool>		commandPool					(createCommandPool(vkd, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, devHelper.queueFamilyIndex));

	const size_t					maxQueuedFrames				= swapchainImages.size()*2;

	// We need to keep hold of fences from vkAcquireNextImageKHR to actually
	// limit number of frames we allow to be queued.
	const vector<FenceSp>			imageReadyFences			(createFences(vkd, device, maxQueuedFrames));

	// We need maxQueuedFrames+1 for imageReadySemaphores pool as we need to pass
	// the semaphore in same time as the fence we use to meter rendering.
	const vector<SemaphoreSp>		imageReadySemaphores		(createSemaphores(vkd, device, maxQueuedFrames+1));

	// For rest we simply need maxQueuedFrames as we will wait for image
	// from frameNdx-maxQueuedFrames to become available to us, guaranteeing that
	// previous uses must have completed.
	const vector<SemaphoreSp>		renderingCompleteSemaphores	(createSemaphores(vkd, device, maxQueuedFrames));
	const vector<CommandBufferSp>	commandBuffers				(allocateCommandBuffers(vkd, device, *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY, maxQueuedFrames));

	try
	{
		const deUint32	numFramesToRender	= 60*10;

		for (deUint32 frameNdx = 0; frameNdx < numFramesToRender; ++frameNdx)
		{
			const VkFence		imageReadyFence		= **imageReadyFences[frameNdx%imageReadyFences.size()];
			const VkSemaphore	imageReadySemaphore	= **imageReadySemaphores[frameNdx%imageReadySemaphores.size()];
			deUint32			imageNdx			= ~0u;

			if (frameNdx >= maxQueuedFrames)
				VK_CHECK(vkd.waitForFences(device, 1u, &imageReadyFence, VK_TRUE, std::numeric_limits<deUint64>::max()));

			VK_CHECK(vkd.resetFences(device, 1, &imageReadyFence));

			{
				const VkResult	acquireResult	= vkd.acquireNextImageKHR(device,
																		  *swapchain,
																		  std::numeric_limits<deUint64>::max(),
																		  imageReadySemaphore,
																		  imageReadyFence,
																		  &imageNdx);

				if (acquireResult == VK_SUBOPTIMAL_KHR)
					context.getTestContext().getLog() << TestLog::Message << "Got " << acquireResult << " at frame " << frameNdx << TestLog::EndMessage;
				else
					VK_CHECK(acquireResult);
			}

			TCU_CHECK((size_t)imageNdx < swapchainImages.size());

			{
				const VkSemaphore			renderingCompleteSemaphore	= **renderingCompleteSemaphores[frameNdx%renderingCompleteSemaphores.size()];
				const VkCommandBuffer		commandBuffer				= **commandBuffers[frameNdx%commandBuffers.size()];
				const VkPipelineStageFlags	waitDstStage				= VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT;
				const VkSubmitInfo			submitInfo					=
				{
					VK_STRUCTURE_TYPE_SUBMIT_INFO,
					DE_NULL,
					1u,
					&imageReadySemaphore,
					&waitDstStage,
					1u,
					&commandBuffer,
					1u,
					&renderingCompleteSemaphore
				};
				const VkPresentInfoKHR		presentInfo					=
				{
					VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
					DE_NULL,
					1u,
					&renderingCompleteSemaphore,
					1u,
					&*swapchain,
					&imageNdx,
					(VkResult*)DE_NULL
				};

				renderer.recordFrame(commandBuffer, imageNdx, frameNdx);
				VK_CHECK(vkd.queueSubmit(devHelper.queue, 1u, &submitInfo, (VkFence)0));
				VK_CHECK(vkd.queuePresentKHR(devHelper.queue, &presentInfo));
			}
		}

		VK_CHECK(vkd.deviceWaitIdle(device));
	}
	catch (...)
	{
		// Make sure device is idle before destroying resources
		vkd.deviceWaitIdle(device);
		throw;
	}

	return tcu::TestStatus::pass("Rendering tests succeeded");
}